

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

void push_window_data(archive_read *a,rar5 *rar,int64_t idx_begin,int64_t idx_end)

{
  uint8_t *buf;
  ulong uVar1;
  long lVar2;
  long offset;
  ulong uVar3;
  size_t size;
  ulong uVar4;
  ulong uVar5;
  
  buf = (rar->cstate).window_buf;
  uVar1 = (rar->cstate).window_mask;
  lVar2 = (rar->cstate).solid_offset;
  offset = (rar->cstate).last_write_ptr;
  uVar3 = offset + lVar2 & uVar1;
  uVar4 = idx_begin + lVar2 & uVar1;
  uVar5 = idx_end + lVar2 & uVar1;
  if ((long)uVar5 < (long)uVar4) {
    size = (rar->cstate).window_size - uVar4;
    push_data_ready(a,rar,buf + uVar3,size,offset);
    push_data_ready(a,rar,buf,uVar5,(rar->cstate).last_write_ptr + size);
    uVar5 = size + uVar5;
  }
  else {
    uVar5 = (idx_end + lVar2) - (idx_begin + lVar2);
    push_data_ready(a,rar,buf + uVar3,uVar1 & uVar5,offset);
  }
  (rar->cstate).last_write_ptr = uVar5 + (rar->cstate).last_write_ptr;
  return;
}

Assistant:

static void push_window_data(struct archive_read* a, struct rar5* rar,
    int64_t idx_begin, int64_t idx_end)
{
	push_data(a, rar, rar->cstate.window_buf, idx_begin, idx_end);
}